

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

bool __thiscall kj::_::NetworkFilter::shouldAllow(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  CidrRange *pCVar1;
  RemoveConst<kj::_::CidrRange> *pRVar2;
  NetworkFilter *pNVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  CidrRange *cidr;
  CidrRange *pCVar10;
  ArrayPtr<const_char> AVar11;
  Fault f;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (addrlen < 2) {
    local_50.exception = (Exception *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    Debug::Fault::init(&local_50,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                      );
    Debug::Fault::fatal(&local_50);
  }
  if (addr->sa_family == 1) {
    AVar11 = safeUnixPath((sockaddr_un *)addr,addrlen);
    if ((AVar11.size_ == 0) || (*AVar11.ptr != '\0')) {
      lVar8 = 0x48;
    }
    else {
      lVar8 = 0x49;
    }
    uVar6 = *(undefined1 *)((long)&(this->super_NetworkFilter)._vptr_NetworkFilter + lVar8);
  }
  else {
    pCVar10 = (this->allowCidrs).builder.ptr;
    pCVar1 = (this->allowCidrs).builder.pos;
    if (pCVar10 == pCVar1) {
      uVar9 = 0;
      bVar5 = false;
    }
    else {
      bVar5 = false;
      uVar9 = 0;
      do {
        bVar4 = CidrRange::matches(pCVar10,addr);
        if (bVar4) {
          if (uVar9 <= pCVar10->bitCount) {
            uVar9 = pCVar10->bitCount;
          }
          bVar5 = true;
        }
        pCVar10 = pCVar10 + 1;
      } while (pCVar10 != pCVar1);
    }
    if (bVar5) {
      pRVar2 = (this->denyCidrs).builder.pos;
      for (pCVar10 = (this->denyCidrs).builder.ptr; pCVar10 != pRVar2; pCVar10 = pCVar10 + 1) {
        bVar5 = CidrRange::matches(pCVar10,addr);
        if ((bVar5) && (uVar9 <= pCVar10->bitCount)) goto LAB_0031829a;
      }
      pNVar3 = (this->next).ptr;
      if (pNVar3 != (NetworkFilter *)0x0) {
        iVar7 = (**(pNVar3->super_NetworkFilter)._vptr_NetworkFilter)(pNVar3,addr,(ulong)addrlen);
        return SUB41(iVar7,0);
      }
      uVar6 = 1;
    }
    else {
LAB_0031829a:
      uVar6 = 0;
    }
  }
  return (bool)uVar6;
}

Assistant:

bool NetworkFilter::shouldAllow(const struct sockaddr* addr, uint addrlen) {
  KJ_REQUIRE(addrlen >= sizeof(addr->sa_family));

#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      return allowAbstractUnix;
    } else {
      return allowUnix;
    }
  }
#endif

  bool allowed = false;
  uint allowSpecificity = 0;
  for (auto& cidr: allowCidrs) {
    if (cidr.matches(addr)) {
      allowSpecificity = kj::max(allowSpecificity, cidr.getSpecificity());
      allowed = true;
    }
  }
  if (!allowed) return false;
  for (auto& cidr: denyCidrs) {
    if (cidr.matches(addr)) {
      if (cidr.getSpecificity() >= allowSpecificity) return false;
    }
  }

  KJ_IF_MAYBE(n, next) {
    return n->shouldAllow(addr, addrlen);
  } else {
    return true;
  }
}